

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_rename.cpp
# Opt level: O1

unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true> __thiscall
duckdb::Transformer::TransformRename(Transformer *this,PGRenameStmt *stmt)

{
  int iVar1;
  _Head_base<0UL,_duckdb::AlterInfo_*,_false> _Var2;
  size_type sVar3;
  reference args_1;
  Transformer *pTVar4;
  pointer pAVar5;
  NotImplementedException *pNVar6;
  long in_RDX;
  pointer *__ptr;
  char *__s;
  char *pcVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  string new_name;
  AlterEntryData data;
  AlterInfo *local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  AlterEntryData local_98;
  
  if (*(long *)(in_RDX + 0x10) == 0) {
    pNVar6 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.catalog._M_dataplus._M_p = (pointer)&local_98.catalog.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Altering schemas is not yet supported","");
    NotImplementedException::NotImplementedException(pNVar6,&local_98.catalog);
    __cxa_throw(pNVar6,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_98.catalog._M_dataplus._M_p = (pointer)&local_98.catalog.field_2;
  local_98.catalog._M_string_length = 0;
  local_98.catalog.field_2._M_local_buf[0] = '\0';
  local_98.schema._M_dataplus._M_p = (pointer)&local_98.schema.field_2;
  local_98.schema._M_string_length = 0;
  local_98.schema.field_2._M_local_buf[0] = '\0';
  local_98.name._M_dataplus._M_p = (pointer)&local_98.name.field_2;
  local_98.name._M_string_length = 0;
  local_98.name.field_2._M_local_buf[0] = '\0';
  local_98.if_not_found = *(OnEntryNotFound *)(in_RDX + 0x3c);
  pcVar7 = *(char **)(*(long *)(in_RDX + 0x10) + 8);
  if (pcVar7 == (char *)0x0) {
    pcVar7 = anon_var_dwarf_643533f + 9;
  }
  strlen(pcVar7);
  ::std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)0x0,(ulong)pcVar7);
  sVar3 = local_98.schema._M_string_length;
  pcVar7 = *(char **)(*(long *)(in_RDX + 0x10) + 0x10);
  __s = anon_var_dwarf_643533f + 9;
  if (pcVar7 != (char *)0x0) {
    __s = pcVar7;
  }
  strlen(__s);
  pTVar4 = (Transformer *)0x0;
  ::std::__cxx11::string::_M_replace((ulong)&local_98.schema,0,(char *)sVar3,(ulong)__s);
  sVar3 = local_98.name._M_string_length;
  pcVar7 = *(char **)(*(long *)(in_RDX + 0x10) + 0x18);
  if (pcVar7 != (char *)0x0) {
    strlen(pcVar7);
    pTVar4 = (Transformer *)0x0;
    ::std::__cxx11::string::_M_replace((ulong)&local_98.name,0,(char *)sVar3,(ulong)pcVar7);
  }
  iVar1 = *(int *)(in_RDX + 4);
  if (iVar1 == 0x30) {
    ::std::__cxx11::string::string
              ((string *)&local_b8,*(char **)(in_RDX + 0x30),(allocator *)&local_d0);
    make_uniq<duckdb::RenameViewInfo,duckdb::AlterEntryData,std::__cxx11::string&>
              ((duckdb *)&local_d0,&local_98,&local_b8);
  }
  else {
    if (iVar1 != 0x26) {
      if (iVar1 != 6) {
        pNVar6 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Schema element not supported yet!","");
        NotImplementedException::NotImplementedException(pNVar6,&local_b8);
        __cxa_throw(pNVar6,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      }
      TransformNameList_abi_cxx11_(&local_d0,pTVar4,*(PGList **)(in_RDX + 0x28));
      ::std::__cxx11::string::string
                ((string *)&local_b8,*(char **)(in_RDX + 0x30),(allocator *)&local_d8);
      if ((long)local_d0.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_d0.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x20) {
        args_1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[](&local_d0,0);
        make_uniq<duckdb::RenameColumnInfo,duckdb::AlterEntryData,std::__cxx11::string,std::__cxx11::string>
                  ((duckdb *)&local_d8,&local_98,args_1,&local_b8);
      }
      else {
        make_uniq<duckdb::RenameFieldInfo,duckdb::AlterEntryData,duckdb::vector<std::__cxx11::string,true>,std::__cxx11::string>
                  ((duckdb *)&local_d8,&local_98,&local_d0,&local_b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_d0);
      local_d0.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d8;
      goto LAB_007a5e10;
    }
    ::std::__cxx11::string::string
              ((string *)&local_b8,*(char **)(in_RDX + 0x30),(allocator *)&local_d0);
    make_uniq<duckdb::RenameTableInfo,duckdb::AlterEntryData,std::__cxx11::string&>
              ((duckdb *)&local_d0,&local_98,&local_b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
LAB_007a5e10:
  pTVar4 = (Transformer *)operator_new(0x80);
  AlterStatement::AlterStatement((AlterStatement *)pTVar4);
  (this->parent).ptr = pTVar4;
  pAVar5 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>::
           operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                       *)this);
  _Var2._M_head_impl =
       (pAVar5->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
       _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
       super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
  (pAVar5->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
  super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl =
       (AlterInfo *)
       local_d0.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (_Var2._M_head_impl != (AlterInfo *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_ParseInfo + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != &local_98.name.field_2) {
    operator_delete(local_98.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.schema._M_dataplus._M_p != &local_98.schema.field_2) {
    operator_delete(local_98.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.catalog._M_dataplus._M_p != &local_98.catalog.field_2) {
    operator_delete(local_98.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>_>)
         (unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>_>)this;
}

Assistant:

unique_ptr<AlterStatement> Transformer::TransformRename(duckdb_libpgquery::PGRenameStmt &stmt) {
	if (!stmt.relation) {
		throw NotImplementedException("Altering schemas is not yet supported");
	}

	unique_ptr<AlterInfo> info;

	AlterEntryData data;
	data.if_not_found = TransformOnEntryNotFound(stmt.missing_ok);
	data.catalog = stmt.relation->catalogname ? stmt.relation->catalogname : INVALID_CATALOG;
	data.schema = stmt.relation->schemaname ? stmt.relation->schemaname : INVALID_SCHEMA;
	if (stmt.relation->relname) {
		data.name = stmt.relation->relname;
	}
	// first we check the type of ALTER
	switch (stmt.renameType) {
	case duckdb_libpgquery::PG_OBJECT_COLUMN: {
		// change column name

		// get the old name and the new name
		auto names = TransformNameList(*stmt.name_list);
		string new_name = stmt.newname;
		if (names.size() == 1) {
			info = make_uniq<RenameColumnInfo>(std::move(data), std::move(names[0]), std::move(new_name));
		} else {
			info = make_uniq<RenameFieldInfo>(std::move(data), std::move(names), std::move(new_name));
		}
		break;
	}
	case duckdb_libpgquery::PG_OBJECT_TABLE: {
		// change table name
		string new_name = stmt.newname;
		info = make_uniq<RenameTableInfo>(std::move(data), new_name);
		break;
	}
	case duckdb_libpgquery::PG_OBJECT_VIEW: {
		// change view name
		string new_name = stmt.newname;
		info = make_uniq<RenameViewInfo>(std::move(data), new_name);
		break;
	}
	case duckdb_libpgquery::PG_OBJECT_DATABASE:
	default:
		throw NotImplementedException("Schema element not supported yet!");
	}
	D_ASSERT(info);

	auto result = make_uniq<AlterStatement>();
	result->info = std::move(info);
	return result;
}